

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t sVar1;
  uint *puVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  Variant *pVVar4;
  SPIRFunction *pSVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  SPIRType *type;
  SPIRVariable *pSVar9;
  MSLConstexprSampler *pMVar10;
  const_iterator cVar11;
  Parameter *pPVar12;
  char (*pacVar13) [16];
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  _Hash_node_base *p_Var14;
  long lVar15;
  uint32_t uVar16;
  ulong uVar17;
  __hashtable *__h;
  Parameter *arg;
  bool bVar18;
  __node_gen_type __node_gen;
  string decl;
  char *sampler_address_space;
  undefined7 in_stack_ffffffffffffff00;
  string local_f8;
  SPIRFunction *local_d8;
  SPIRType *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  undefined4 local_84;
  SPIRVariable *local_80;
  undefined1 local_78 [8];
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ulong local_58;
  Parameter *local_50;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char *local_38;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  this_00 = &(this->super_CompilerGLSL).local_variable_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&(this->super_CompilerGLSL).resource_names._M_h);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  bVar18 = (func->super_IVariant).self.id ==
           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  (this->super_CompilerGLSL).processing_entry_point = bVar18;
  if (!bVar18) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  local_d8 = func;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(func->super_IVariant).field_0xc);
  if (((type->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
     ((this->msl_options).force_native_arrays != true)) {
    func_type_decl_abi_cxx11_(&local_f8,this,type);
    ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&local_c8);
  }
  ::std::__cxx11::string::append((char *)&local_c8);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_f8,this,(ulong)(local_d8->super_IVariant).self.id,1);
  ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_c8);
  if (((type->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     ((this->msl_options).force_native_arrays == true)) {
    ::std::__cxx11::string::append((char *)&local_c8);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_f8,this,type,0);
    ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&local_c8);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_f8,this,type,0);
    ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
    pSVar5 = local_d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((pSVar5->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size != 0)
    {
      ::std::__cxx11::string::append((char *)&local_c8);
    }
  }
  if ((this->super_CompilerGLSL).processing_entry_point == true) {
    if ((this->msl_options).argument_buffers == true) {
      entry_point_args_argument_buffer_abi_cxx11_
                (&local_f8,this,
                 (local_d8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
    }
    else {
      entry_point_args_classic_abi_cxx11_
                (&local_f8,this,
                 (local_d8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    p_Var14 = (this->super_CompilerGLSL).resource_names._M_h._M_before_begin._M_nxt;
    local_f8._M_dataplus._M_p = (pointer)this_00;
    if (p_Var14 != (_Hash_node_base *)0x0) {
      do {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this_00,p_Var14 + 1,&local_f8);
        p_Var14 = p_Var14->_M_nxt;
      } while (p_Var14 != (_Hash_node_base *)0x0);
    }
    sVar1 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    if (sVar1 != 0) {
      puVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr;
      lVar15 = 0;
      do {
        pSVar9 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)((long)puVar2 + lVar15));
        uVar7 = (pSVar9->initializer).id;
        if (uVar7 == 0) {
          uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          (pSVar9->initializer).id = uVar7;
        }
        if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr[uVar7].type & ~TypeExpression) == TypeNone) {
          local_f8._M_dataplus._M_p._0_1_ = 1;
          in_R8 = &local_f8;
          Compiler::
          set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                    ((Compiler *)this,uVar7,(char (*) [3])0x390978,
                     (TypedID<(spirv_cross::Types)1> *)&(pSVar9->super_IVariant).field_0xc,
                     (bool *)in_R8);
        }
        lVar15 = lVar15 + 4;
      } while (sVar1 << 2 != lVar15);
    }
    sVar1 = (local_d8->local_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    if (sVar1 != 0) {
      pTVar3 = (local_d8->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      lVar15 = 0;
      do {
        pSVar9 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)((long)&pTVar3->id + lVar15));
        if (pSVar9->storage == StorageClassTaskPayloadWorkgroupEXT) {
          CompilerGLSL::add_local_variable_name
                    (&this->super_CompilerGLSL,*(uint32_t *)((long)&pTVar3->id + lVar15));
          local_70 = 0;
          local_78._4_4_ = *(uint32_t *)((long)&pTVar3->id + lVar15);
          local_78._0_4_ = *(undefined4 *)&(pSVar9->super_IVariant).field_0xc;
          local_68._M_local_buf[0] = true;
          argument_decl_abi_cxx11_(&local_a8,this,(Parameter *)local_78);
          join<char_const(&)[3],std::__cxx11::string,char_const(&)[13]>
                    (&local_f8,(spirv_cross *)0x394b62,(char (*) [3])&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     " [[payload]]",(char (*) [13])in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        lVar15 = lVar15 + 4;
      } while (sVar1 << 2 != lVar15);
    }
  }
  sVar1 = (local_d8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  if (sVar1 != 0) {
    arg = (local_d8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    local_50 = arg + sVar1;
    local_40 = &this->plane_name_suffix;
    pPVar12 = (Parameter *)&this->buffers_requiring_array_length;
    local_48 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)pPVar12;
    do {
      uVar7 = (arg->id).id;
      uVar17 = (ulong)uVar7;
      local_84 = (undefined4)CONCAT71((int7)((ulong)pPVar12 >> 8),1);
      if ((uVar17 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar17].type == TypeVariable))
      {
        local_80 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar17);
        uVar8 = (local_80->basevariable).id;
        if (uVar8 == 0) {
          uVar8 = uVar7;
        }
        if (arg->alias_global_variable == false) {
          uVar8 = uVar7;
        }
        local_80->parameter = arg;
        local_84 = 0;
        uVar17 = (ulong)uVar8;
      }
      else {
        local_80 = (SPIRVariable *)0x0;
      }
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(uint32_t)uVar17);
      argument_decl_abi_cxx11_(&local_f8,this,arg);
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      cVar6 = Compiler::has_extended_decoration
                        ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
      local_d0 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
      if (local_d0->basetype == SampledImage && cVar6 == '\0') {
        local_58 = uVar17;
        pMVar10 = find_constexpr_sampler(this,(uint32_t)uVar17);
        if ((pMVar10 != (MSLConstexprSampler *)0x0) && (pMVar10->ycbcr_conversion_enable != false))
        {
          uVar7 = pMVar10->planes;
          local_78._0_4_ = 1;
          if (1 < uVar7) {
            do {
              argument_decl_abi_cxx11_(&local_a8,this,arg);
              in_R8 = (string *)local_78;
              join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                        (&local_f8,(spirv_cross *)0x394b62,(char (*) [3])&local_a8,local_40,
                         (string *)local_78,(uint *)in_R9);
              ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              local_78._0_4_ = local_78._0_4_ + 1;
            } while ((uint)local_78._0_4_ < uVar7);
          }
        }
        uVar17 = local_58;
        if ((local_d0->image).dim != Buffer) {
          uVar16 = (uint32_t)local_58;
          if ((local_d0->array).super_VectorView<unsigned_int>.buffer_size == 0) {
LAB_0023f967:
            sampler_type_abi_cxx11_(&local_a8,this,local_d0,(arg->id).id,false);
            to_sampler_expression_abi_cxx11_((string *)local_78,this,uVar16);
            in_R8 = (string *)local_78;
            join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                      (&local_f8,(spirv_cross *)0x394b62,(char (*) [3])&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a6d9
                       ,(char (*) [2])local_78,in_R9);
            ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
          }
          else {
            if ((char)local_84 == '\0') {
              bVar18 = is_var_runtime_size_array(this,local_80);
            }
            else {
              bVar18 = Compiler::is_runtime_size_array(local_d0);
            }
            if (bVar18 != false) goto LAB_0023f967;
            local_38 = descriptor_address_space
                                 (this,uVar16,StorageClassUniformConstant,"thread const");
            sampler_type_abi_cxx11_(&local_a8,this,local_d0,uVar16,false);
            to_sampler_expression_abi_cxx11_((string *)local_78,this,uVar16);
            in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3928d9;
            in_R8 = &local_a8;
            join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                      (&local_f8,(spirv_cross *)0x394b62,(char (*) [3])&local_38,(char **)0x36a6d9,
                       (char (*) [2])&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3928d9
                       ,(char (*) [3])local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(cVar6,in_stack_ffffffffffffff00));
            ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._4_4_,local_78._0_4_) != &local_68) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_78._4_4_,local_78._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
      }
      uVar16 = (uint32_t)uVar17;
      if (((this->msl_options).swizzle_texture_samples == true) &&
         (this->has_sampled_images == true)) {
        bVar18 = Compiler::is_sampled_image_type((Compiler *)this,local_d0);
        if (cVar6 == '\0' && bVar18) {
          sVar1 = (local_d0->array).super_VectorView<unsigned_int>.buffer_size;
          to_swizzle_expression_abi_cxx11_(&local_a8,this,uVar16);
          pacVar13 = (char (*) [16])0x397f11;
          if (sVar1 == 0) {
            pacVar13 = (char (*) [16])0x3928d9;
          }
          join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                    (&local_f8,(spirv_cross *)", constant uint",pacVar13,(char (*) [3])&local_a8,
                     in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
      }
      local_f8._M_dataplus._M_p._0_4_ = uVar16;
      cVar11 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(local_48,(key_type *)&local_f8);
      if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        sVar1 = (local_d0->array).super_VectorView<unsigned_int>.buffer_size;
        to_buffer_size_expression_abi_cxx11_(&local_a8,this,uVar16);
        pacVar13 = (char (*) [16])0x397f11;
        if (sVar1 == 0) {
          pacVar13 = (char (*) [16])0x3928d9;
        }
        join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                  (&local_f8,(spirv_cross *)", constant uint",pacVar13,(char (*) [3])&local_a8,in_R8
                  );
        ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      pPVar12 = (local_d8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr +
                ((local_d8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size - 1);
      if (arg != pPVar12) {
        pPVar12 = (Parameter *)::std::__cxx11::string::append((char *)&local_c8);
      }
      arg = arg + 1;
    } while (arg != local_50);
  }
  ::std::__cxx11::string::append((char *)&local_c8);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type, 0);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}

		// add `taskPayloadSharedEXT` variable to entry-point arguments
		for (auto &v : func.local_variables)
		{
			auto &var = get<SPIRVariable>(v);
			if (var.storage != StorageClassTaskPayloadWorkgroupEXT)
				continue;

			add_local_variable_name(v);
			SPIRFunction::Parameter arg = {};
			arg.id = v;
			arg.type = var.basetype;
			arg.alias_global_variable = true;
			decl += join(", ", argument_decl(arg), " [[payload]]");
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty() || (var ? is_var_runtime_size_array(*var) : is_runtime_size_array(arg_type)))
				{
					decl += join(", ", sampler_type(arg_type, arg.id, false), " ", to_sampler_expression(name_id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, name_id, false), "& ",
					             to_sampler_expression(name_id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(name_id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}